

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

Iterator * leveldb::NewErrorIterator(Status *status)

{
  EmptyIterator *this;
  Status *in_stack_ffffffffffffffe8;
  
  this = (EmptyIterator *)operator_new(0x30);
  anon_unknown_4::EmptyIterator::EmptyIterator(this,in_stack_ffffffffffffffe8);
  return &this->super_Iterator;
}

Assistant:

Iterator* NewErrorIterator(const Status& status) {
  return new EmptyIterator(status);
}